

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O1

void __thiscall
StringEqualFailure::StringEqualFailure
          (StringEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,char *expected
          ,char *actual,SimpleString *text)

{
  SimpleString *this_00;
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_00164c40;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffa8,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)&stack0xffffffffffffffa8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffa8);
  StringFromOrNull(&stack0xffffffffffffffb8);
  StringFromOrNull(&stack0xffffffffffffffc8);
  pcVar3 = SimpleString::asCharString((SimpleString *)&stack0xffffffffffffffb8);
  pcVar4 = SimpleString::asCharString((SimpleString *)&stack0xffffffffffffffc8);
  StringFromFormat(&stack0xffffffffffffffa8,"expected <%s>\n\tbut was  <%s>",pcVar3,pcVar4);
  SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffa8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffa8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb8);
  if (actual != (char *)0x0 && expected != (char *)0x0) {
    lVar5 = -1;
    do {
      lVar1 = lVar5 + 1;
      lVar6 = lVar5 + 1;
      lVar2 = lVar5 + 1;
      lVar5 = lVar6;
    } while (actual[lVar1] == expected[lVar2]);
    SimpleString::SimpleString((SimpleString *)&stack0xffffffffffffffb8,actual);
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)&stack0xffffffffffffffa8,(SimpleString *)actual,
               (size_t)&stack0xffffffffffffffb8,(DifferenceFormat)lVar6);
    SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffa8);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffa8);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb8);
  }
  return;
}

Assistant:

StringEqualFailure::StringEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const char* expected, const char* actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromOrNull(expected), StringFromOrNull(actual));
    if((expected) && (actual))
    {
        size_t failStart;
        for (failStart = 0; actual[failStart] == expected[failStart]; failStart++)
            ;
        message_ += createDifferenceAtPosString(actual, failStart);
    }
}